

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O1

void host_cpuid_x86_64(uint32_t function,uint32_t count,uint32_t *eax,uint32_t *ebx,uint32_t *ecx,
                      uint32_t *edx)

{
  uint32_t *puVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  
  if (function == 0) {
    puVar1 = (uint32_t *)cpuid_basic_info(0);
  }
  else if (function == 1) {
    puVar1 = (uint32_t *)cpuid_Version_info(1);
  }
  else if (function == 2) {
    puVar1 = (uint32_t *)cpuid_cache_tlb_info(2);
  }
  else if (function == 3) {
    puVar1 = (uint32_t *)cpuid_serial_info(3);
  }
  else if (function == 4) {
    puVar1 = (uint32_t *)cpuid_Deterministic_Cache_Parameters_info(4);
  }
  else if (function == 5) {
    puVar1 = (uint32_t *)cpuid_MONITOR_MWAIT_Features_info(5);
  }
  else if (function == 6) {
    puVar1 = (uint32_t *)cpuid_Thermal_Power_Management_info(6);
  }
  else if (function == 7) {
    puVar1 = (uint32_t *)cpuid_Extended_Feature_Enumeration_info(7);
  }
  else if (function == 9) {
    puVar1 = (uint32_t *)cpuid_Direct_Cache_Access_info(9);
  }
  else if (function == 10) {
    puVar1 = (uint32_t *)cpuid_Architectural_Performance_Monitoring_info(10);
  }
  else if (function == 0xb) {
    puVar1 = (uint32_t *)cpuid_Extended_Topology_info(0xb);
  }
  else if (function == 0xd) {
    puVar1 = (uint32_t *)cpuid_Processor_Extended_States_info(0xd);
  }
  else if (function == 0xf) {
    puVar1 = (uint32_t *)cpuid_Quality_of_Service_info(0xf);
  }
  else if (function == 0x80000002) {
    puVar1 = (uint32_t *)cpuid_brand_part1_info(0x80000002);
  }
  else if (function == 0x80000003) {
    puVar1 = (uint32_t *)cpuid_brand_part2_info(0x80000003);
  }
  else if (function == 0x80000004) {
    puVar1 = (uint32_t *)cpuid_brand_part3_info(0x80000004);
  }
  else {
    puVar1 = (uint32_t *)cpuid(function);
  }
  uVar2 = puVar1[1];
  uVar3 = puVar1[2];
  uVar4 = puVar1[3];
  if (eax != (uint32_t *)0x0) {
    *eax = *puVar1;
  }
  if (ebx != (uint32_t *)0x0) {
    *ebx = uVar2;
  }
  if (ecx != (uint32_t *)0x0) {
    *ecx = uVar4;
  }
  if (edx != (uint32_t *)0x0) {
    *edx = uVar3;
  }
  return;
}

Assistant:

void host_cpuid(uint32_t function, uint32_t count,
                uint32_t *eax, uint32_t *ebx, uint32_t *ecx, uint32_t *edx)
{
    uint32_t vec[4];

#ifdef _MSC_VER
    __cpuidex((int*)vec, function, count);
#else
#ifdef __x86_64__
    asm volatile("cpuid"
                 : "=a"(vec[0]), "=b"(vec[1]),
                   "=c"(vec[2]), "=d"(vec[3])
                 : "0"(function), "c"(count) : "cc");
#elif defined(__i386__)
    asm volatile("pusha \n\t"
                 "cpuid \n\t"
                 "mov %%eax, 0(%2) \n\t"
                 "mov %%ebx, 4(%2) \n\t"
                 "mov %%ecx, 8(%2) \n\t"
                 "mov %%edx, 12(%2) \n\t"
                 "popa"
                 : : "a"(function), "c"(count), "S"(vec)
                 : "memory", "cc");
#else
    abort();
#endif
#endif // _MSC_VER

    if (eax)
        *eax = vec[0];
    if (ebx)
        *ebx = vec[1];
    if (ecx)
        *ecx = vec[2];
    if (edx)
        *edx = vec[3];
}